

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrayops.c
# Opt level: O0

LispPTR N_OP_aref2(LispPTR arrayarg,LispPTR inx0,LispPTR inx1)

{
  LispPTR LVar1;
  undefined8 uVar2;
  LispPTR *pLVar3;
  LispPTR *pLVar4;
  int j;
  LispArray *arrayblk;
  uint local_20;
  int temp;
  int arindex;
  LispPTR baseL;
  LispPTR inx1_local;
  LispPTR inx0_local;
  LispPTR arrayarg_local;
  
  if ((*(ushort *)((ulong)(MDStypetbl + (arrayarg >> 9)) ^ 2) & 0x7ff) != 0xf) {
    MachineState.tosvalue = inx1;
    MachineState.errorexit = 1;
    return 0xffffffff;
  }
  pLVar3 = NativeAligned4FromLAddr(arrayarg);
  uVar2 = *(undefined8 *)pLVar3;
  if ((inx1 & 0xfff0000) == 0xe0000) {
    arrayblk._4_4_ = inx1 & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(MDStypetbl + (inx1 >> 9)) ^ 2) & 0x7ff) != 2) {
      MachineState.tosvalue = inx1;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    pLVar4 = NativeAligned4FromLAddr(inx1);
    arrayblk._4_4_ = *pLVar4;
    if ((arrayblk._4_4_ & 0x80000000) != 0) {
      MachineState.tosvalue = inx1;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
  }
  LVar1 = pLVar3[4];
  if ((int)LVar1 <= (int)arrayblk._4_4_) {
    MachineState.tosvalue = inx1;
    MachineState.errorexit = 1;
    return 0xffffffff;
  }
  if ((inx0 & 0xfff0000) == 0xe0000) {
    local_20 = inx0 & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(MDStypetbl + (inx0 >> 9)) ^ 2) & 0x7ff) != 2) {
      MachineState.tosvalue = inx1;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    pLVar4 = NativeAligned4FromLAddr(inx0);
    local_20 = *pLVar4;
    if ((local_20 & 0x80000000) != 0) {
      MachineState.tosvalue = inx1;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
  }
  if ((int)local_20 < (int)pLVar3[2]) {
    inx0_local = aref_switch((ushort)((ulong)*(undefined8 *)pLVar3 >> 0x30) & 0xff,inx1,
                             (uint)uVar2 & 0xfffffff,arrayblk._4_4_ + LVar1 * local_20);
  }
  else {
    MachineState.errorexit = 1;
    inx0_local = 0xffffffff;
    MachineState.tosvalue = inx1;
  }
  return inx0_local;
}

Assistant:

LispPTR N_OP_aref2(LispPTR arrayarg, LispPTR inx0, LispPTR inx1) {
  LispPTR baseL;
  int arindex, temp;
  LispArray *arrayblk;
  int j;

  /*  verify array  */
  if (GetTypeNumber(arrayarg) != TYPE_TWOD_ARRAY) ERROR_EXIT(inx1);
  arrayblk = (LispArray *)NativeAligned4FromLAddr(arrayarg);
  baseL = arrayblk->base;

  /*  test and setup index  */
  N_GetPos(inx1, temp, inx1);
  if (temp >= (j = arrayblk->Dim1)) ERROR_EXIT(inx1);
  N_GetPos(inx0, arindex, inx1);
  if (arindex >= arrayblk->Dim0) ERROR_EXIT(inx1);
  arindex *= j;
  arindex += temp;

  /*  disp on type  */
  return (aref_switch(arrayblk->typenumber, inx1, baseL, arindex));
}